

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

char * __thiscall
duckdb::StrfTimeFormat::WritePadded3(StrfTimeFormat *this,char *target,uint32_t value)

{
  if (value < 100) {
    *target = '0';
    target[1] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)value * 2];
    target[2] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(value * 2) + 1];
  }
  else {
    *(undefined2 *)(target + 1) =
         *(undefined2 *)
          (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(value % 100) * 2);
    *target = (char)(value / 100) + '0';
  }
  return target + 3;
}

Assistant:

char *StrfTimeFormat::WritePadded3(char *target, uint32_t value) const {
	D_ASSERT(value < 1000);
	if (value >= 100) {
		WritePadded2(target + 1, value % 100);
		*target = char(uint8_t('0') + value / 100);
		return target + 3;
	} else {
		*target = '0';
		target++;
		return WritePadded2(target, value);
	}
}